

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptor::GetSourceLocation
          (FileDescriptor *this,vector<int,_std::allocator<int>_> *path,SourceLocation *out_location
          )

{
  SourceCodeInfo *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  SourceCodeInfo_Location *pSVar4;
  RepeatedField<int> *pRVar5;
  int *piVar6;
  string *psVar7;
  RepeatedField<int> *span;
  int i;
  SourceCodeInfo *info;
  SourceLocation *out_location_local;
  vector<int,_std::allocator<int>_> *path_local;
  FileDescriptor *this_local;
  
  internal::CheckNotNull<google::protobuf::SourceLocation>
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
             ,1999,"\'out_location\' must not be NULL",out_location);
  this_00 = *(SourceCodeInfo **)(this + 0x98);
  span._4_4_ = 0;
  while( true ) {
    bVar1 = false;
    if (this_00 != (SourceCodeInfo *)0x0) {
      iVar2 = SourceCodeInfo::location_size(this_00);
      bVar1 = span._4_4_ < iVar2;
    }
    if (!bVar1) break;
    pSVar4 = SourceCodeInfo::location(this_00,span._4_4_);
    pRVar5 = SourceCodeInfo_Location::path(pSVar4);
    bVar1 = PathsEqual(path,pRVar5);
    if (bVar1) {
      pSVar4 = SourceCodeInfo::location(this_00,span._4_4_);
      pRVar5 = SourceCodeInfo_Location::span(pSVar4);
      iVar2 = RepeatedField<int>::size(pRVar5);
      if ((iVar2 == 3) || (iVar2 = RepeatedField<int>::size(pRVar5), iVar2 == 4)) {
        piVar6 = RepeatedField<int>::Get(pRVar5,0);
        out_location->start_line = *piVar6;
        piVar6 = RepeatedField<int>::Get(pRVar5,1);
        out_location->start_column = *piVar6;
        iVar3 = RepeatedField<int>::size(pRVar5);
        iVar2 = 2;
        if (iVar3 == 3) {
          iVar2 = 0;
        }
        piVar6 = RepeatedField<int>::Get(pRVar5,iVar2);
        out_location->end_line = *piVar6;
        iVar2 = RepeatedField<int>::size(pRVar5);
        piVar6 = RepeatedField<int>::Get(pRVar5,iVar2 + -1);
        out_location->end_column = *piVar6;
        pSVar4 = SourceCodeInfo::location(this_00,span._4_4_);
        psVar7 = SourceCodeInfo_Location::leading_comments_abi_cxx11_(pSVar4);
        std::__cxx11::string::operator=((string *)&out_location->leading_comments,(string *)psVar7);
        pSVar4 = SourceCodeInfo::location(this_00,span._4_4_);
        psVar7 = SourceCodeInfo_Location::trailing_comments_abi_cxx11_(pSVar4);
        std::__cxx11::string::operator=((string *)&out_location->trailing_comments,(string *)psVar7)
        ;
        return true;
      }
    }
    span._4_4_ = span._4_4_ + 1;
  }
  return false;
}

Assistant:

bool FileDescriptor::GetSourceLocation(const vector<int>& path,
                                       SourceLocation* out_location) const {
  GOOGLE_CHECK_NOTNULL(out_location);
  const SourceCodeInfo* info = source_code_info_;
  for (int i = 0; info && i < info->location_size(); ++i) {
    if (PathsEqual(path, info->location(i).path())) {
      const RepeatedField<int32>& span = info->location(i).span();
      if (span.size() == 3 || span.size() == 4) {
        out_location->start_line   = span.Get(0);
        out_location->start_column = span.Get(1);
        out_location->end_line     = span.Get(span.size() == 3 ? 0 : 2);
        out_location->end_column   = span.Get(span.size() - 1);

        out_location->leading_comments = info->location(i).leading_comments();
        out_location->trailing_comments = info->location(i).trailing_comments();
        return true;
      }
    }
  }
  return false;
}